

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Disk.cpp
# Opt level: O0

void __thiscall Disk::test(Disk *this)

{
  Disk *pDVar1;
  ostream *poVar2;
  size_t in_RCX;
  int local_144;
  undefined1 local_140 [4];
  int i;
  undefined1 local_120 [32];
  undefined1 local_100 [40];
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [32];
  undefined1 local_90 [32];
  undefined1 local_70 [40];
  string local_48 [48];
  Disk *local_18;
  Disk *disk;
  Disk *this_local;
  
  disk = this;
  pDVar1 = (Disk *)operator_new(0x10000);
  Disk(pDVar1);
  local_18 = pDVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"2323",(allocator *)(local_70 + 0x27));
  write(pDVar1,0xea,local_48,in_RCX);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)(local_70 + 0x27));
  poVar2 = std::operator<<((ostream *)&std::cout,"\n234: should be 4538:\t");
  read_abi_cxx11_((Disk *)local_70,(int)local_18,(void *)0xea,in_RCX);
  std::operator<<(poVar2,(string *)local_70);
  std::__cxx11::string::~string((string *)local_70);
  poVar2 = std::operator<<((ostream *)&std::cout,"\n0: should be 0:\t");
  read_abi_cxx11_((Disk *)local_90,(int)local_18,(void *)0x0,in_RCX);
  std::operator<<(poVar2,(string *)local_90);
  std::__cxx11::string::~string((string *)local_90);
  pDVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"23232",&local_b1);
  write(pDVar1,0xeb,local_b0,in_RCX);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  pDVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"34434",(allocator *)(local_100 + 0x27));
  write(pDVar1,0xea,local_d8,in_RCX);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)(local_100 + 0x27));
  poVar2 = std::operator<<((ostream *)&std::cout,"\n234: should be 2333:\t");
  read_abi_cxx11_((Disk *)local_100,(int)local_18,(void *)0xea,in_RCX);
  std::operator<<(poVar2,(string *)local_100);
  std::__cxx11::string::~string((string *)local_100);
  poVar2 = std::operator<<((ostream *)&std::cout,"\n235: should be 12344:\t");
  read_abi_cxx11_((Disk *)local_120,(int)local_18,(void *)0xeb,in_RCX);
  std::operator<<(poVar2,(string *)local_120);
  std::__cxx11::string::~string((string *)local_120);
  poVar2 = std::operator<<((ostream *)&std::cout,"\n236: should be 0:\t");
  read_abi_cxx11_((Disk *)local_140,(int)local_18,(void *)0xec,in_RCX);
  std::operator<<(poVar2,(string *)local_140);
  std::__cxx11::string::~string((string *)local_140);
  for (local_144 = 0; local_144 < 0x800; local_144 = local_144 + 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             (string *)(&this->field_0x0 + (long)local_144 * 0x20));
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void Disk::test() {
    Disk *disk = new Disk();
    disk->write(234, "2323");
    std::cout << "\n234: should be 4538:\t" << disk->read(234);
    std::cout << "\n0: should be 0:\t" << disk->read(0);
    disk->write(235, "23232");
    disk->write(234, "34434");
    std::cout << "\n234: should be 2333:\t" << disk->read(234);
    std::cout << "\n235: should be 12344:\t" << disk->read(235);
    std::cout << "\n236: should be 0:\t" << disk->read(236);
    for (int i = 0; i < 2048; i++)
        std::cout << disk_data[i] << std::endl;
}